

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

int * __thiscall
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::findNode
          (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *this,BSTNode *t,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  uint uVar1;
  
  while( true ) {
    if (t == (BSTNode *)0x0) {
      return (int *)0x0;
    }
    uVar1 = compareKeys(this,key,&t->key);
    if (uVar1 == 0) break;
    t = (&t->left)[~uVar1 >> 0x1f];
  }
  return &t->value;
}

Assistant:

ValueType *findNode(BSTNode *t, const KeyType & key) const {
      if (t == NULL)  return NULL;
      int sign = compareKeys(key, t->key);
      if (sign == 0) return &t->value;
      if (sign < 0) {
         return findNode(t->left, key);
      } else {
         return findNode(t->right, key);
      }
   }